

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansi_code.c
# Opt level: O3

char * mpt_ansi_code(uint8_t type)

{
  char *pcVar1;
  
  if ((type & 0x20) != 0) {
    return (char *)0x0;
  }
  if (type == '\0') {
    return "\x1b[1m";
  }
  if (0xf < type) {
    return "\x1b[32m";
  }
  if (7 < type) {
    return "\x1b[34m";
  }
  if (3 < type) {
    return "\x1b[33m";
  }
  pcVar1 = "\x1b[31m";
  if (type == '\x03') {
    pcVar1 = "\x1b[35m";
  }
  return pcVar1;
}

Assistant:

extern const char *mpt_ansi_code(uint8_t type)
{
	if (type & MPT_LOG(File)) {
		return 0;
	}
	if (!type) return "\033[1m";
	if (type >= MPT_LOG(Debug))    return "\033[32m";
	if (type >= MPT_LOG(Info))     return "\033[34m";
	if (type >= MPT_LOG(Warning))  return "\033[33m";
	if (type >= MPT_LOG(Error))    return "\033[35m";
	return "\033[31m";
}